

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O0

void pystring::os::path::split_posix(string *head,string *tail,string *p)

{
  string *__lhs;
  uint uVar1;
  int n;
  bool local_b1;
  string local_b0;
  byte local_89;
  string local_88;
  string local_68;
  string local_48;
  int local_24;
  string *psStack_20;
  int i;
  string *p_local;
  string *tail_local;
  string *head_local;
  
  psStack_20 = p;
  p_local = tail;
  tail_local = head;
  local_24 = rfind(p,(string *)forward_slash_abi_cxx11_,0,0x7fffffff);
  local_24 = local_24 + 1;
  slice(&local_48,psStack_20,0,local_24);
  std::__cxx11::string::operator=((string *)tail_local,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  slice(&local_68,psStack_20,local_24,0x7fffffff);
  std::__cxx11::string::operator=((string *)p_local,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  uVar1 = std::__cxx11::string::empty();
  __lhs = tail_local;
  local_89 = 0;
  local_b1 = false;
  if ((uVar1 & 1) == 0) {
    n = std::__cxx11::string::size();
    mul(&local_88,(string *)forward_slash_abi_cxx11_,n);
    local_89 = 1;
    local_b1 = std::operator!=(__lhs,&local_88);
  }
  if ((local_89 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (local_b1 != false) {
    rstrip(&local_b0,tail_local,(string *)forward_slash_abi_cxx11_);
    std::__cxx11::string::operator=((string *)tail_local,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return;
}

Assistant:

void split_posix(std::string & head, std::string & tail, const std::string & p)
    {
        int i = pystring::rfind(p, forward_slash) + 1;
        
        head = pystring::slice(p,0,i);
        tail = pystring::slice(p,i);
        
        if(!head.empty() && (head != pystring::mul(forward_slash, (int) head.size())))
        {
            head = pystring::rstrip(head, forward_slash);
        }
    }